

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoginState.cpp
# Opt level: O2

int __thiscall LoginState::init(LoginState *this,EVP_PKEY_CTX *ctx)

{
  iterator iVar1;
  int connection_id;
  int local_25c;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_258;
  __shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> local_248;
  string local_238;
  Connection local_218;
  
  std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_248,(__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)ctx);
  GameState::init(&this->super_GameState,(EVP_PKEY_CTX *)&local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_248._M_refcount);
  std::__cxx11::string::string
            ((string *)&local_238,"Welcome to SkelMUD!\r\nPlease enter your m_username\r\n",
             (allocator *)&local_25c);
  std::__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_258,(__shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2> *)ctx);
  Sender::Send(&local_238,(shared_ptr<Connection> *)&local_258);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_258._M_refcount);
  std::__cxx11::string::~string((string *)&local_238);
  Connection::Connection(&local_218,*(Connection **)ctx);
  GameState::CleanPrompt(&this->super_GameState,&local_218);
  Connection::~Connection(&local_218);
  local_25c = Connection::GetID(*(Connection **)ctx);
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::find(&(this->m_state_map)._M_t,&local_25c);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_state_map)._M_t._M_impl.super__Rb_tree_header) {
    iVar1._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::operator[]
                   (&this->m_state_map,&local_25c);
    (iVar1._M_node)->_M_color = _S_red;
  }
  return (int)iVar1._M_node;
}

Assistant:

void LoginState::init(std::shared_ptr<Connection> connection) {
    GameState::init(connection);
    Sender::Send("Welcome to SkelMUD!\r\nPlease enter your m_username\r\n", connection);
    CleanPrompt(*connection);
    //connection->SetPrompt(GetPrompt(*connection));
    int connection_id = connection->GetID();
    if(m_state_map.find(connection_id) == m_state_map.end())
        m_state_map[connection_id] = USERNAME;
}